

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall
ON_Mesh::Cleanup(ON_Mesh *this,bool bRemoveNgons,bool bRemoveDegenerateFaces,bool bCompact)

{
  undefined7 in_register_00000031;
  
  V4V5_DestroyNgonList(this);
  if ((int)CONCAT71(in_register_00000031,bRemoveNgons) != 0) {
    SetNgonCount(this,0);
  }
  if (bRemoveDegenerateFaces) {
    CullDegenerateFaces(this);
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])(this,1);
  if (bCompact) {
    Compact(this);
    return;
  }
  return;
}

Assistant:

void ON_Mesh::Cleanup(
  bool bRemoveNgons, 
  bool bRemoveDegenerateFaces, 
  bool bCompact
  )
{
  V4V5_DestroyNgonList(); // old junk
  
  if ( bRemoveNgons )
    SetNgonCount(0);
  
  if (bRemoveDegenerateFaces)
    CullDegenerateFaces();

  DestroyRuntimeCache(true);  
  
  if ( bCompact )
    Compact();
}